

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_superblock.c
# Opt level: O0

size_t ZSTD_compressSubBlock
                 (ZSTD_entropyCTables_t *entropy,ZSTD_entropyCTablesMetadata_t *entropyMetadata,
                 seqDef *sequences,size_t nbSeq,BYTE *literals,size_t litSize,BYTE *llCode,
                 BYTE *mlCode,BYTE *ofCode,ZSTD_CCtx_params *cctxParams,void *dst,size_t dstCapacity
                 ,int bmi2,int writeLitEntropy,int writeSeqEntropy,int *litEntropyWritten,
                 int *seqEntropyWritten,U32 lastBlock)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  U32 cBlockHeader24;
  size_t cSize;
  size_t err_code_1;
  size_t cSeqSize;
  size_t err_code;
  size_t cLitSize;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  size_t litSize_local;
  BYTE *literals_local;
  size_t nbSeq_local;
  seqDef *sequences_local;
  ZSTD_entropyCTablesMetadata_t *entropyMetadata_local;
  ZSTD_entropyCTables_t *entropy_local;
  
  pvVar2 = (void *)((long)dst + 3);
  entropy_local =
       (ZSTD_entropyCTables_t *)
       ZSTD_compressSubBlock_literal
                 ((HUF_CElt *)entropy,&entropyMetadata->hufMetadata,literals,litSize,pvVar2,
                  (long)dst + (dstCapacity - (long)pvVar2),bmi2,writeLitEntropy,litEntropyWritten);
  uVar1 = ERR_isError((size_t)entropy_local);
  if (uVar1 == 0) {
    if (entropy_local == (ZSTD_entropyCTables_t *)0x0) {
      entropy_local = (ZSTD_entropyCTables_t *)0x0;
    }
    else {
      pvVar2 = (void *)((long)pvVar2 + (long)(&(entropy_local->huf).CTable[0].field_0x3 + -3));
      entropy_local =
           (ZSTD_entropyCTables_t *)
           ZSTD_compressSubBlock_sequences
                     (&entropy->fse,&entropyMetadata->fseMetadata,sequences,nbSeq,llCode,mlCode,
                      ofCode,cctxParams,pvVar2,(long)dst + (dstCapacity - (long)pvVar2),bmi2,
                      writeSeqEntropy,seqEntropyWritten);
      uVar1 = ERR_isError((size_t)entropy_local);
      if (uVar1 == 0) {
        if (entropy_local == (ZSTD_entropyCTables_t *)0x0) {
          entropy_local = (ZSTD_entropyCTables_t *)0x0;
        }
        else {
          lVar3 = (long)pvVar2 + (long)(&(entropy_local->huf).CTable[0].field_0x3 + -3);
          MEM_writeLE24(dst,lastBlock + 4 + (((int)lVar3 - (int)dst) + -3) * 8);
          entropy_local = (ZSTD_entropyCTables_t *)(lVar3 - (long)dst);
        }
      }
    }
  }
  return (size_t)entropy_local;
}

Assistant:

static size_t ZSTD_compressSubBlock(const ZSTD_entropyCTables_t* entropy,
                                    const ZSTD_entropyCTablesMetadata_t* entropyMetadata,
                                    const seqDef* sequences, size_t nbSeq,
                                    const BYTE* literals, size_t litSize,
                                    const BYTE* llCode, const BYTE* mlCode, const BYTE* ofCode,
                                    const ZSTD_CCtx_params* cctxParams,
                                    void* dst, size_t dstCapacity,
                                    const int bmi2,
                                    int writeLitEntropy, int writeSeqEntropy,
                                    int* litEntropyWritten, int* seqEntropyWritten,
                                    U32 lastBlock)
{
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstCapacity;
    BYTE* op = ostart + ZSTD_blockHeaderSize;
    DEBUGLOG(5, "ZSTD_compressSubBlock (litSize=%zu, nbSeq=%zu, writeLitEntropy=%d, writeSeqEntropy=%d, lastBlock=%d)",
                litSize, nbSeq, writeLitEntropy, writeSeqEntropy, lastBlock);
    {   size_t cLitSize = ZSTD_compressSubBlock_literal((const HUF_CElt*)entropy->huf.CTable,
                                                        &entropyMetadata->hufMetadata, literals, litSize,
                                                        op, oend-op, bmi2, writeLitEntropy, litEntropyWritten);
        FORWARD_IF_ERROR(cLitSize, "ZSTD_compressSubBlock_literal failed");
        if (cLitSize == 0) return 0;
        op += cLitSize;
    }
    {   size_t cSeqSize = ZSTD_compressSubBlock_sequences(&entropy->fse,
                                                  &entropyMetadata->fseMetadata,
                                                  sequences, nbSeq,
                                                  llCode, mlCode, ofCode,
                                                  cctxParams,
                                                  op, oend-op,
                                                  bmi2, writeSeqEntropy, seqEntropyWritten);
        FORWARD_IF_ERROR(cSeqSize, "ZSTD_compressSubBlock_sequences failed");
        if (cSeqSize == 0) return 0;
        op += cSeqSize;
    }
    /* Write block header */
    {   size_t cSize = (op-ostart)-ZSTD_blockHeaderSize;
        U32 const cBlockHeader24 = lastBlock + (((U32)bt_compressed)<<1) + (U32)(cSize << 3);
        MEM_writeLE24(ostart, cBlockHeader24);
    }
    return op-ostart;
}